

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

SequenceRange
slang::ast::SequenceRange::fromSyntax
          (RangeSelectSyntax *syntax,ASTContext *context,bool allowUnbounded)

{
  not_null<slang::syntax::ExpressionSyntax_*> *this;
  bool bVar1;
  int iVar2;
  ExpressionSyntax *pEVar3;
  optional<int> oVar4;
  SyntaxNode *pSVar5;
  undefined4 extraout_var;
  Type *this_00;
  Diagnostic *pDVar6;
  uint7 in_register_00000011;
  _Storage<int,_true> arg;
  undefined4 uVar7;
  not_null<slang::syntax::ExpressionSyntax_*> *this_01;
  SourceRange SVar8;
  SequenceRange SVar9;
  _Storage<int,_true> local_40;
  _Storage<int,_true> _Stack_3c;
  
  local_40._M_value = 1;
  this = &syntax->left;
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::get(this);
  oVar4 = ASTContext::evalInteger(context,pEVar3,(bitmask<slang::ast::ASTFlags>)0x200000);
  pSVar5 = &not_null<slang::syntax::ExpressionSyntax_*>::get(this)->super_SyntaxNode;
  SVar8 = slang::syntax::SyntaxNode::sourceRange(pSVar5);
  bVar1 = ASTContext::requirePositive(context,oVar4,SVar8);
  arg._M_value = oVar4.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int>._M_payload;
  if (bVar1) {
    local_40._M_value = arg._M_value;
  }
  this_01 = &syntax->right;
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::get(this_01);
  iVar2 = Expression::bind((int)pEVar3,(sockaddr *)context,(uint)allowUnbounded << 0xb | 0x240000);
  this_00 = not_null<const_slang::ast::Type_*>::get
                      (&((Expression *)CONCAT44(extraout_var,iVar2))->type);
  bVar1 = Type::isUnbounded(this_00);
  if (!bVar1) {
    oVar4 = ASTContext::evalInteger(context,(Expression *)CONCAT44(extraout_var,iVar2));
    pSVar5 = &not_null<slang::syntax::ExpressionSyntax_*>::get(this_01)->super_SyntaxNode;
    SVar8 = slang::syntax::SyntaxNode::sourceRange(pSVar5);
    bVar1 = ASTContext::requirePositive(context,oVar4,SVar8);
    if (bVar1) {
      _Stack_3c._M_value =
           oVar4.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      uVar7 = (undefined4)CONCAT71(in_register_00000011 & 0xffffff,1);
      if (_Stack_3c._M_value < arg._M_value) {
        pSVar5 = &not_null<slang::syntax::ExpressionSyntax_*>::get(this)->super_SyntaxNode;
        SVar8 = slang::syntax::SyntaxNode::sourceRange(pSVar5);
        pDVar6 = ASTContext::addDiag(context,(DiagCode)0x400008,SVar8);
        pSVar5 = &not_null<slang::syntax::ExpressionSyntax_*>::get(this_01)->super_SyntaxNode;
        SVar8 = slang::syntax::SyntaxNode::sourceRange(pSVar5);
        Diagnostic::operator<<(pDVar6,SVar8);
        pDVar6 = Diagnostic::operator<<(pDVar6,arg._M_value);
        Diagnostic::operator<<(pDVar6,_Stack_3c._M_value);
      }
      goto LAB_00300bd7;
    }
  }
  uVar7 = 0;
LAB_00300bd7:
  SVar9.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value = _Stack_3c._M_value;
  SVar9.min = local_40._M_value;
  SVar9.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._4_4_ = uVar7;
  return SVar9;
}

Assistant:

SequenceRange SequenceRange::fromSyntax(const RangeSelectSyntax& syntax, const ASTContext& context,
                                        bool allowUnbounded) {
    SequenceRange range;
    auto l = context.evalInteger(*syntax.left, ASTFlags::AssertionDelayOrRepetition);
    if (context.requirePositive(l, syntax.left->sourceRange()))
        range.min = uint32_t(*l);

    // The rhs can be an unbounded '$' so we need extra AST flags.
    bitmask<ASTFlags> flags = ASTFlags::AssertionExpr | ASTFlags::AssertionDelayOrRepetition;
    if (allowUnbounded)
        flags |= ASTFlags::AllowUnboundedLiteral;

    auto& re = Expression::bind(*syntax.right, context, flags);
    if (re.type->isUnbounded())
        return range;

    auto r = context.evalInteger(re);
    if (context.requirePositive(r, syntax.right->sourceRange())) {
        range.max = uint32_t(*r);
        if (*l > *r) {
            auto& diag = context.addDiag(diag::SeqRangeMinMax, syntax.left->sourceRange());
            diag << syntax.right->sourceRange();
            diag << *l << *r;
        }
    }

    return range;
}